

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O2

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
          (StringBuilder<Memory::ArenaAllocator> *this,char16 *str)

{
  for (; *str != L'\0'; str = str + 1) {
    Append(this,*str);
  }
  return;
}

Assistant:

void AppendSz(const char16 * str)
        {
            // WARNING!!
            // Do not use this to append JavascriptStrings.  They can have embedded
            // nulls which obviously won't be handled correctly here.  Instead use
            // Append with a length, which will use memcpy and correctly include any
            // embedded null characters.
            // WARNING!!

            while (*str != _u('\0'))
            {
                Append(*str++);
            }
        }